

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fifo_reader.c
# Opt level: O0

int main(void)

{
  int __fd;
  ssize_t sVar1;
  int fd;
  char *myfifo;
  char data;
  
  myfifo._4_4_ = 0;
  myfifo._3_1_ = ' ';
  __fd = open("/tmp/myfifo",2);
  if (__fd == 0) {
    perror("Cannot open fifo");
    unlink("/tmp/myfifo");
    exit(1);
  }
  printf("Waiting for characters.....\n");
  while (myfifo._3_1_ != '#') {
    while (sVar1 = read(__fd,(void *)((long)&myfifo + 3),1), sVar1 != 0 && myfifo._3_1_ != '#') {
      fprintf(_stderr,"%c",(ulong)(uint)(int)myfifo._3_1_);
    }
  }
  close(__fd);
  unlink("/tmp/myfifo");
  return 0;
}

Assistant:

int main ()
{
    char data = ' ';
    char * myfifo = "/tmp/myfifo";
    
    int fd = open(myfifo, O_RDWR);
    
    if (fd == 0) 
    {
        perror("Cannot open fifo");
        unlink(myfifo);exit(1);
        
    }
    printf("Waiting for characters.....\n");
    while (data != '#') 
    {
        while (read(fd, &data, 1) && (data != '#'))
            fprintf(stderr, "%c", data);
        
    }
    close(fd);
    unlink(myfifo);
    return 0;
    
}